

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing_v2.cpp
# Opt level: O1

string * create_file_with_removed_comments(string *__return_storage_ptr__,string *file_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  long *plVar6;
  istream *piVar7;
  ostream *poVar8;
  string no_comment_name;
  string line;
  ofstream no_comment_file_write;
  ifstream file;
  string local_498;
  char *local_478;
  long local_470;
  char local_468 [16];
  undefined1 *local_458 [2];
  undefined1 local_448 [16];
  undefined1 *local_438;
  filebuf local_430 [8];
  undefined1 local_428 [232];
  ios_base local_340 [264];
  long local_238 [65];
  
  std::ifstream::ifstream((ifstream *)local_238,(string *)file_name,_S_in);
  bVar2 = problem_with_file_to_read((ifstream *)local_238,file_name);
  if (bVar2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::string::substr((ulong)&local_438,(ulong)file_name);
    pcVar5 = (char *)std::__cxx11::string::append((char *)&local_438);
    plVar6 = (long *)std::__cxx11::string::append(pcVar5);
    local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_498,*plVar6,plVar6[1] + *plVar6);
    if (local_438 != local_428) {
      operator_delete(local_438);
    }
    std::ofstream::ofstream(&local_438,(string *)&local_498,_S_out);
    bVar2 = problem_with_file_to_write((ofstream *)&local_438,&local_498);
    if (bVar2) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    }
    else {
      local_478 = local_468;
      local_470 = 0;
      local_468[0] = '\0';
      while( true ) {
        cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                (char)(ifstream *)local_238);
        piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_238,(string *)&local_478,cVar3);
        if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
        std::__cxx11::string::substr((ulong)local_458,(ulong)&local_478);
        iVar4 = std::__cxx11::string::compare((char *)local_458);
        if (local_458[0] != local_448) {
          operator_delete(local_458[0]);
        }
        if (iVar4 != 0) {
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_438,local_478,local_470);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
        }
      }
      std::ifstream::close();
      std::ofstream::close();
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      paVar1 = &local_498.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p == paVar1) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_498.field_2._M_allocated_capacity._1_7_,
                      local_498.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_498.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_498._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_498.field_2._M_allocated_capacity._1_7_,
                      local_498.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = local_498._M_string_length;
      local_498._M_string_length = 0;
      local_498.field_2._M_local_buf[0] = '\0';
      local_498._M_dataplus._M_p = (pointer)paVar1;
      if (local_478 != local_468) {
        operator_delete(local_478);
      }
    }
    local_438 = _VTT;
    *(undefined8 *)(local_430 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
    std::filebuf::~filebuf(local_430);
    std::ios_base::~ios_base(local_340);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != &local_498.field_2) {
      operator_delete(local_498._M_dataplus._M_p);
    }
  }
  std::ifstream::~ifstream(local_238);
  return __return_storage_ptr__;
}

Assistant:

string create_file_with_removed_comments(const string &file_name) {
    // Open the files:
    ifstream file(file_name);
    if (problem_with_file_to_read(file, file_name)) return "";
    string no_comment_name = file_name.substr(0, file_name.length() - 4).append("_no_comment").append(".txt");
    ofstream no_comment_file_write(no_comment_name);
    if (problem_with_file_to_write(no_comment_file_write, no_comment_name)) return "";
    // Copy content, but only NON-comment lines:
    string line;
    while (getline(file, line)) {
        if (line.substr(0, 4) != COMMENT) no_comment_file_write << line << endl;
    }
    file.close();
    no_comment_file_write.close();

    return no_comment_name;
}